

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseFloatingLiteralTest_Test::
~OpenDDLParserTest_parseFloatingLiteralTest_Test
          (OpenDDLParserTest_parseFloatingLiteralTest_Test *this)

{
  OpenDDLParserTest_parseFloatingLiteralTest_Test *this_local;
  
  ~OpenDDLParserTest_parseFloatingLiteralTest_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseFloatingLiteralTest) {
    size_t len(0);
    Value *data(nullptr);
    char token1[] = "1.0f", *end1(findEnd(token1, len));
    char *out = OpenDDLParser::parseFloatingLiteral(token1, end1, &data);
    EXPECT_NE(out, token1);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_float, data->m_type);
    EXPECT_EQ(1.0f, data->getFloat());
    registerValueForDeletion(data);

    char token2[] = "-1.0f", *end2(findEnd(token2, len));
    out = OpenDDLParser::parseFloatingLiteral(token2, end2, &data);
    EXPECT_NE(out, token2);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_float, data->m_type);
    EXPECT_EQ(-1.0f, data->getFloat());
    registerValueForDeletion(data);
}